

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O0

bool __thiscall Scs::Socket::IsInvalid(Socket *this)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  int lastError;
  int result;
  timeval tmval;
  fd_set *__arr;
  undefined1 local_98 [4];
  uint __i;
  fd_set socketSet;
  Socket *this_local;
  
  socketSet.fds_bits[0xf] = (__fd_mask)this;
  if (this->m_socket == -1) {
    this_local._7_1_ = true;
  }
  else {
    tmval.tv_usec = (__suseconds_t)local_98;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(tmval.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
    }
    lVar3 = (long)(this->m_socket / 0x40);
    *(ulong *)(local_98 + lVar3 * 8) =
         1L << ((byte)((long)this->m_socket % 0x40) & 0x3f) | *(ulong *)(local_98 + lVar3 * 8);
    _lastError = 0;
    tmval.tv_sec = 1000;
    iVar1 = select(this->m_socket + 1,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)local_98,
                   (timeval *)&lastError);
    puVar2 = (uint *)__errno_location();
    if (iVar1 == -1) {
      LogWriteLine("Socket IsInvalid() failed: %d",(ulong)*puVar2);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = iVar1 == 1;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Socket::IsInvalid() const
{
	if (m_socket == INVALID_SOCKET)
		return true;
	fd_set socketSet;
	FD_ZERO(&socketSet);
	FD_SET(m_socket, &socketSet);
	timeval tmval;
	tmval.tv_sec = 0;
	tmval.tv_usec = 1000;
	int result = select(static_cast<int>(m_socket + 1), nullptr, nullptr, &socketSet, &tmval);
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR)
	{
		LogWriteLine("Socket IsInvalid() failed: %d", lastError);
		return false;
	}
	return (result == 1) ? true : false;
}